

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

RelationalKind * __thiscall
matchit::impl::Id<mathiu::impl::RelationalKind>::get(Id<mathiu::impl::RelationalKind> *this)

{
  BlockT *this_00;
  RelationalKind *pRVar1;
  Id<mathiu::impl::RelationalKind> *this_local;
  
  this_00 = block(this);
  pRVar1 = IdBlock<mathiu::impl::RelationalKind>::get(this_00);
  return pRVar1;
}

Assistant:

constexpr decltype(auto) get() { return block().get(); }